

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O2

void __thiscall
kj::Exception::Exception(Exception *this,Type type,char *file,int line,String *description)

{
  size_t sVar1;
  size_t extraout_RDX;
  StringPtr SVar2;
  
  (this->ownFile).content.ptr = (char *)0x0;
  (this->ownFile).content.size_ = 0;
  (this->ownFile).content.disposer = (ArrayDisposer *)0x0;
  sVar1 = strlen(file);
  SVar2.content.size_ = extraout_RDX;
  SVar2.content.ptr = (char *)(sVar1 + 1);
  SVar2 = trimSourceFilename((kj *)file,SVar2);
  this->file = SVar2.content.ptr;
  this->line = line;
  this->type = type;
  (this->description).content.ptr = (description->content).ptr;
  (this->description).content.size_ = (description->content).size_;
  (this->description).content.disposer = (description->content).disposer;
  (description->content).ptr = (char *)0x0;
  (description->content).size_ = 0;
  this->traceCount = 0;
  this->isFullTrace = false;
  (this->details).builder.endPtr = (Detail *)0x0;
  (this->details).builder.ptr = (Detail *)0x0;
  (this->details).builder.pos = (RemoveConst<kj::Exception::Detail> *)0x0;
  (this->remoteTrace).content.disposer = (ArrayDisposer *)0x0;
  (this->context).ptr.disposer = (Disposer *)0x0;
  (this->context).ptr.ptr = (Context *)0x0;
  (this->remoteTrace).content.ptr = (char *)0x0;
  (this->remoteTrace).content.size_ = 0;
  (this->details).builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  return;
}

Assistant:

Exception::Exception(Type type, const char* file, int line, String description) noexcept
    : file(trimSourceFilename(file).cStr()), line(line), type(type), description(mv(description)),
      traceCount(0) {}